

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

FunctionDeclarationSyntax * __thiscall
slang::parsing::Parser::parseFunctionDeclaration
          (Parser *this,AttrList attributes,SyntaxKind functionKind,TokenKind endKind,
          SyntaxKind parentKind)

{
  Token end_00;
  FunctionPrototypeSyntax *prototype;
  NamedBlockClauseSyntax *endBlock;
  SyntaxNode *this_00;
  FunctionDeclarationSyntax *pFVar1;
  Token TVar2;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> sVar3;
  Token semi;
  bool isConstructor;
  SyntaxKind local_bc;
  pointer local_b8;
  Info *local_b0;
  undefined8 local_a8;
  Token end;
  SyntaxList<slang::syntax::SyntaxNode> local_90;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  local_b8 = attributes.data_;
  local_bc = functionKind;
  Token::Token(&end);
  prototype = parseFunctionPrototype
                        (this,parentKind,(bitmask<slang::parsing::detail::FunctionOptions>)0x5,
                         &isConstructor);
  TVar2 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_b0 = TVar2.info;
  local_a8 = TVar2._0_8_;
  sVar3 = parseBlockItems(this,endKind,&end,isConstructor);
  endBlock = parseNamedBlockClause(this);
  this_00 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&prototype->name);
  TVar2 = slang::syntax::SyntaxNode::getLastToken(this_00);
  if ((TVar2.kind == NewKeyword) || (TVar2.kind == Identifier)) {
    checkBlockNames(this,TVar2,endBlock);
  }
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_90.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       local_b8;
  local_90.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004703a8;
  local_90.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00472ea0;
  end_00.info = end.info;
  end_00.kind = end.kind;
  end_00._2_1_ = end._2_1_;
  end_00.numFlags.raw = end.numFlags.raw;
  end_00.rawLen = end.rawLen;
  semi.info = local_b0;
  semi.kind = (undefined2)local_a8;
  semi._2_1_ = local_a8._2_1_;
  semi.numFlags.raw = local_a8._3_1_;
  semi.rawLen = local_a8._4_4_;
  local_90.super_SyntaxListBase.childCount = sVar3.size_;
  local_90.super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> = sVar3;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind =
       local_90.super_SyntaxListBase.super_SyntaxNode.kind;
  local_60.super_SyntaxListBase.childCount = attributes.size_;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
       attributes.size_;
  pFVar1 = slang::syntax::SyntaxFactory::functionDeclaration
                     (&this->factory,local_bc,&local_60,prototype,semi,&local_90,end_00,endBlock);
  return pFVar1;
}

Assistant:

FunctionDeclarationSyntax& Parser::parseFunctionDeclaration(AttrList attributes,
                                                            SyntaxKind functionKind,
                                                            TokenKind endKind,
                                                            SyntaxKind parentKind) {
    Token end;
    bool isConstructor;
    auto& prototype = parseFunctionPrototype(parentKind,
                                             FunctionOptions::AllowImplicitReturn |
                                                 FunctionOptions::AllowTasks,
                                             &isConstructor);

    auto semi = expect(TokenKind::Semicolon);
    auto items = parseBlockItems(endKind, end, isConstructor);
    auto endBlockName = parseNamedBlockClause();

    Token nameToken = prototype.name->getLastToken();
    if (nameToken.kind == TokenKind::Identifier || nameToken.kind == TokenKind::NewKeyword)
        checkBlockNames(nameToken, endBlockName);

    return factory.functionDeclaration(functionKind, attributes, prototype, semi, items, end,
                                       endBlockName);
}